

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  bool bVar2;
  SpecialProperties SVar3;
  bool bVar4;
  string *psVar5;
  bool bVar6;
  ulong uVar7;
  string tag;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCaseInfo info;
  string local_1b0;
  string local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  TestCaseInfo local_140;
  
  local_140.name._M_dataplus._M_p = (pointer)&local_140.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"./","");
  bVar2 = startsWith(_name,&local_140.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.name._M_dataplus._M_p != &local_140.name.field_2) {
    operator_delete(local_140.name._M_dataplus._M_p);
  }
  local_170._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_170._M_impl.super__Rb_tree_header._M_header;
  local_170._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_170._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_170._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_170._M_impl.super__Rb_tree_header._M_header._M_right =
       local_170._M_impl.super__Rb_tree_header._M_header._M_left;
  if (_descOrTags->_M_string_length != 0) {
    bVar4 = false;
    uVar7 = 0;
    do {
      cVar1 = (_descOrTags->_M_dataplus)._M_p[uVar7];
      if (bVar4) {
        psVar5 = &local_1b0;
        if (cVar1 == ']') {
          SVar3 = parseSpecialTag(&local_1b0);
          if (SVar3 == None) {
            enforceNotReservedTag(&local_1b0,_lineInfo);
            bVar6 = bVar2;
          }
          else {
            bVar6 = true;
            if (SVar3 != IsHidden) {
              bVar6 = bVar2;
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_unique(&local_170,&local_1b0);
          local_1b0._M_string_length = 0;
          *local_1b0._M_dataplus._M_p = '\0';
          bVar4 = false;
          bVar2 = bVar6;
        }
        else {
LAB_0012e581:
          std::__cxx11::string::push_back((char)psVar5);
        }
      }
      else {
        psVar5 = &local_190;
        if (cVar1 != '[') goto LAB_0012e581;
        bVar4 = true;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < _descOrTags->_M_string_length);
  }
  if (bVar2 != false) {
    local_140.name._M_dataplus._M_p = (pointer)&local_140.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"hide","");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_unique(&local_170,&local_140.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.name._M_dataplus._M_p != &local_140.name.field_2) {
      operator_delete(local_140.name._M_dataplus._M_p);
    }
    local_140.name._M_dataplus._M_p = (pointer)&local_140.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,".","");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_unique(&local_170,&local_140.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.name._M_dataplus._M_p != &local_140.name.field_2) {
      operator_delete(local_140.name._M_dataplus._M_p);
    }
  }
  TestCaseInfo::TestCaseInfo
            (&local_140,_name,_className,&local_190,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_170,_lineInfo);
  TestCase::TestCase(__return_storage_ptr__,_testCase,&local_140);
  TestCaseInfo::~TestCaseInfo(&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_170,(_Link_type)local_170._M_impl.super__Rb_tree_header._M_header._M_parent);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden( startsWith( _name, "./" ) ); // Legacy support

        // Parse out tags
        std::set<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for( std::size_t i = 0; i < _descOrTags.size(); ++i ) {
            char c = _descOrTags[i];
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( prop == TestCaseInfo::IsHidden )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    tags.insert( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.insert( "hide" );
            tags.insert( "." );
        }

        TestCaseInfo info( _name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, info );
    }